

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http2.c
# Opt level: O0

void Curl_http2_remove_child(Curl_easy *parent,Curl_easy *child)

{
  bool bVar1;
  Curl_http2_dep *local_28;
  Curl_http2_dep *data;
  Curl_http2_dep *last;
  Curl_easy *child_local;
  Curl_easy *parent_local;
  
  data = (Curl_http2_dep *)0x0;
  local_28 = (parent->set).stream_dependents;
  while( true ) {
    bVar1 = false;
    if (local_28 != (Curl_http2_dep *)0x0) {
      bVar1 = local_28->data != child;
    }
    if (!bVar1) break;
    data = local_28;
    local_28 = local_28->next;
  }
  if (local_28 != (Curl_http2_dep *)0x0) {
    if (data == (Curl_http2_dep *)0x0) {
      (parent->set).stream_dependents = local_28->next;
    }
    else {
      data->next = local_28->next;
    }
    (*Curl_cfree)(local_28);
  }
  (child->set).stream_depends_on = (Curl_easy *)0x0;
  *(ulong *)&(child->set).field_0x8e2 = *(ulong *)&(child->set).field_0x8e2 & 0xffffdfffffffffff;
  return;
}

Assistant:

void Curl_http2_remove_child(struct Curl_easy *parent, struct Curl_easy *child)
{
  struct Curl_http2_dep *last = 0;
  struct Curl_http2_dep *data = parent->set.stream_dependents;
  DEBUGASSERT(child->set.stream_depends_on == parent);

  while(data && data->data != child) {
    last = data;
    data = data->next;
  }

  DEBUGASSERT(data);

  if(data) {
    if(last) {
      last->next = data->next;
    }
    else {
      parent->set.stream_dependents = data->next;
    }
    free(data);
  }

  child->set.stream_depends_on = 0;
  child->set.stream_depends_e = FALSE;
}